

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O1

void sznet::sz_localtime(tm *t,time_t n)

{
  time_t local_18;
  
  if (n == -1) {
    n = time((time_t *)0x0);
  }
  local_18 = n;
  localtime_r(&local_18,(tm *)t);
  return;
}

Assistant:

void sz_localtime(struct tm& t, time_t n)
{
	time_t lt;
	if (n == -1)
	{
		lt = time(nullptr);
	}
	else
	{
		lt = n;
	}
#if SZ_OS_LINUX
	localtime_r(&lt, &t);
#else
	t = *(localtime(&lt));
#endif
}